

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_ext_key_share_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  uchar *data;
  size_t len;
  undefined1 local_80 [8];
  CBB ciphertext;
  CBB entry;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->pake_verifier);
  if (bVar1) {
    hs_local._7_1_ = true;
  }
  else {
    iVar2 = CBB_add_u16(out,0x33);
    if ((iVar2 != 0) &&
       (iVar2 = CBB_add_u16_length_prefixed(out,(CBB *)((long)&ciphertext.u + 0x18)), iVar2 != 0)) {
      psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         (&hs->new_session);
      iVar2 = CBB_add_u16((CBB *)((long)&ciphertext.u + 0x18),psVar3->group_id);
      if ((iVar2 != 0) &&
         (iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&ciphertext.u + 0x18),(CBB *)local_80),
         iVar2 != 0)) {
        data = Array<unsigned_char>::data(&hs->key_share_ciphertext);
        len = Array<unsigned_char>::size(&hs->key_share_ciphertext);
        iVar2 = CBB_add_bytes((CBB *)local_80,data,len);
        if ((iVar2 != 0) && (iVar2 = CBB_flush(out), iVar2 != 0)) {
          return true;
        }
      }
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_ext_key_share_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (hs->pake_verifier) {
    // We don't add the key share extension if a PAKE is offered.
    return true;
  }

  CBB entry, ciphertext;
  if (!CBB_add_u16(out, TLSEXT_TYPE_key_share) ||
      !CBB_add_u16_length_prefixed(out, &entry) ||
      !CBB_add_u16(&entry, hs->new_session->group_id) ||
      !CBB_add_u16_length_prefixed(&entry, &ciphertext) ||
      !CBB_add_bytes(&ciphertext, hs->key_share_ciphertext.data(),
                     hs->key_share_ciphertext.size()) ||
      !CBB_flush(out)) {
    return false;
  }
  return true;
}